

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  int *piVar1;
  Allocator *pAVar2;
  NetPrivate *pNVar3;
  int iVar4;
  long lVar5;
  reference pvVar6;
  reference pvVar7;
  ulong uVar8;
  reference pvVar9;
  reference ppLVar10;
  long *in_RSI;
  long *in_RDI;
  int lr_1;
  int custom_index_1;
  Layer *layer_cpu;
  Option opt1;
  int lr;
  int j_4;
  int j_3;
  int dims;
  Blob *blob_2;
  int j_2;
  int *psh;
  Mat shape_hints;
  int pdlr;
  int layer_support_vulkan;
  Blob *blob_1;
  int top_blob_index;
  int j_1;
  Blob *blob;
  int bottom_blob_index;
  int j;
  int custom_index;
  Layer *layer;
  int top_count;
  int bottom_count;
  int typeindex;
  int i;
  ParamDict pd;
  int blob_count;
  int layer_count;
  int magic;
  undefined4 in_stack_fffffffffffff8d0;
  int in_stack_fffffffffffff8d4;
  Mat *in_stack_fffffffffffff8d8;
  int iVar11;
  NetPrivate *in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8f0;
  int in_stack_fffffffffffff8f4;
  NetPrivate *in_stack_fffffffffffff900;
  DataReader *in_stack_fffffffffffff958;
  ParamDict *in_stack_fffffffffffff960;
  Mat *in_stack_fffffffffffff968;
  Mat *in_stack_fffffffffffff970;
  Mat *pMVar12;
  Net *in_stack_fffffffffffff980;
  NetPrivate *local_590;
  byte local_569;
  int local_540;
  int local_53c;
  ParamDict local_538;
  undefined8 local_528;
  undefined4 local_520;
  long *local_518;
  undefined4 local_510;
  int local_50c;
  int local_508;
  undefined4 local_504;
  int local_500;
  ulong local_4f8;
  void *local_4f0;
  int *local_4e8;
  undefined8 local_4e0;
  undefined4 local_4d8;
  long *local_4d0;
  undefined4 local_4c8;
  int local_4c4;
  int local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  long local_4b0;
  void *local_4a8;
  int *local_4a0;
  undefined8 local_498;
  undefined4 local_490;
  long *local_488;
  undefined4 local_480;
  int local_47c;
  undefined4 local_478;
  undefined4 local_474;
  undefined4 local_470;
  long local_468;
  int local_45c;
  reference local_458;
  int local_44c;
  int *local_448;
  Mat local_440;
  Mat local_3f8;
  int local_3b0;
  uint local_3ac;
  reference local_3a8;
  int local_3a0;
  int local_39c;
  reference local_398;
  int local_38c;
  int local_388;
  uint local_384;
  NetPrivate *local_380;
  int local_378;
  int local_368;
  int local_364;
  uint local_360;
  uint local_35c;
  ParamDict local_358;
  int local_344;
  int local_340;
  int local_33c;
  long *local_338;
  int local_324;
  Mat *local_320;
  int local_318;
  undefined4 local_314;
  Mat *local_310;
  reference local_308;
  reference local_300;
  int local_2f8;
  undefined4 local_2f4;
  Mat *local_2f0;
  reference local_2e8;
  reference local_2e0;
  ParamDict *local_2d0;
  Mat *local_2c8;
  Mat *local_2c0;
  void **local_2b0;
  Mat *local_2a8;
  Mat *local_2a0;
  void **local_290;
  Mat *local_288;
  Mat *local_280;
  Mat *local_278;
  void **local_268;
  void **local_258;
  ParamDict *local_248;
  Mat *local_238;
  Mat *local_228;
  int local_210;
  undefined4 local_20c;
  Mat *local_208;
  int local_1f0;
  undefined4 local_1ec;
  ParamDict *local_1e8;
  int local_1d0;
  undefined4 local_1cc;
  void **local_1c8;
  int local_1b0;
  undefined4 local_1ac;
  void **local_1a8;
  int local_190;
  undefined4 local_18c;
  Mat *local_188;
  int local_180;
  undefined4 local_17c;
  Mat *local_178;
  int local_170;
  undefined4 local_16c;
  Mat *local_168;
  int local_160;
  undefined4 local_15c;
  Mat *local_158;
  int local_150;
  undefined4 local_14c;
  reference local_148;
  int local_140;
  undefined4 local_13c;
  reference local_138;
  Mat *local_130;
  undefined8 local_128;
  undefined4 local_11c;
  undefined8 local_118;
  undefined8 local_110;
  int local_104;
  void **local_100;
  undefined8 local_f8;
  undefined4 local_ec;
  undefined8 local_e8;
  undefined8 local_e0;
  int local_d8;
  int local_d4;
  void **local_d0;
  undefined8 local_c8;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  ParamDict *local_98;
  Mat *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  void *local_50;
  void *local_40;
  _func_int **local_30;
  undefined4 local_c;
  long local_8;
  
  local_33c = 0;
  local_338 = in_RSI;
  lVar5 = (**(code **)(*in_RSI + 0x18))(in_RSI,&local_33c,4);
  if (lVar5 == 4) {
    if (local_33c == 0x7685dd) {
      local_340 = 0;
      local_344 = 0;
      lVar5 = (**(code **)(*local_338 + 0x18))(local_338,&local_340,4);
      if (lVar5 == 4) {
        lVar5 = (**(code **)(*local_338 + 0x18))(local_338,&local_344,4);
        if (lVar5 == 4) {
          if ((local_340 < 1) || (local_344 < 1)) {
            fprintf(_stderr,"invalid layer_count or blob_count");
            fprintf(_stderr,"\n");
            local_324 = -1;
          }
          else {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                       (size_type)in_stack_fffffffffffff8e8);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                       CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                       (size_type)in_stack_fffffffffffff8e8);
            ParamDict::ParamDict
                      ((ParamDict *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
            for (local_35c = 0; (int)local_35c < local_340; local_35c = local_35c + 1) {
              lVar5 = (**(code **)(*local_338 + 0x18))(local_338,&local_360,4);
              if (lVar5 != 4) {
                fprintf(_stderr,"read typeindex failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                local_378 = 1;
                goto LAB_0015ef7a;
              }
              lVar5 = (**(code **)(*local_338 + 0x18))(local_338,&local_364,4);
              if (lVar5 != 4) {
                fprintf(_stderr,"read bottom_count failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                local_378 = 1;
                goto LAB_0015ef7a;
              }
              lVar5 = (**(code **)(*local_338 + 0x18))(local_338,&local_368,4);
              if (lVar5 != 4) {
                fprintf(_stderr,"read top_count failed");
                fprintf(_stderr,"\n");
                local_324 = -1;
                local_378 = 1;
                goto LAB_0015ef7a;
              }
              local_380 = (NetPrivate *)(**(code **)(*in_RDI + 0x30))(in_RDI,local_360);
              if (local_380 == (NetPrivate *)0x0) {
                local_380 = (NetPrivate *)
                            create_layer_cpu((int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
              }
              if (local_380 == (NetPrivate *)0x0) {
                local_384 = local_360 & 0xfffffeff;
                local_380 = (NetPrivate *)(**(code **)(*in_RDI + 0x28))(in_RDI,local_384);
              }
              if (local_380 == (NetPrivate *)0x0) {
                fprintf(_stderr,"layer %d not exists or registered",(ulong)local_360);
                fprintf(_stderr,"\n");
                clear(in_stack_fffffffffffff980);
                local_324 = -1;
                local_378 = 1;
                goto LAB_0015ef7a;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                         (size_type)in_stack_fffffffffffff8e8);
              for (local_388 = 0; local_388 < local_364; local_388 = local_388 + 1) {
                lVar5 = (**(code **)(*local_338 + 0x18))(local_338,&local_38c,4);
                if (lVar5 != 4) {
                  fprintf(_stderr,"read bottom_blob_index failed");
                  fprintf(_stderr,"\n");
                  local_324 = -1;
                  local_378 = 1;
                  goto LAB_0015ef7a;
                }
                local_398 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI[9] + 8),(long)local_38c);
                iVar11 = local_38c;
                local_398->consumer = local_35c;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)
                                    &(local_380->input_blob_names).
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,(long)local_388);
                *pvVar6 = iVar11;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                         (size_type)in_stack_fffffffffffff8e8);
              for (local_39c = 0; local_39c < local_368; local_39c = local_39c + 1) {
                lVar5 = (**(code **)(*local_338 + 0x18))(local_338,&local_3a0,4);
                if (lVar5 != 4) {
                  fprintf(_stderr,"read top_blob_index failed");
                  fprintf(_stderr,"\n");
                  local_324 = -1;
                  local_378 = 1;
                  goto LAB_0015ef7a;
                }
                local_3a8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI[9] + 8),(long)local_3a0);
                iVar11 = local_3a0;
                local_3a8->producer = local_35c;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)
                                    &(local_380->output_blob_names).
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,(long)local_39c);
                *pvVar6 = iVar11;
              }
              local_3ac = *(bool *)((long)&(local_380->blobs).
                                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 2) & 1;
              local_3b0 = ParamDict::load_param_bin
                                    (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
              if (local_3b0 == 0) {
                local_320 = &local_440;
                local_440.data = (void *)0x0;
                local_440.refcount = (int *)0x0;
                local_440.elemsize = 0;
                local_440.elempack = 0;
                local_440.allocator = (Allocator *)0x0;
                local_440.dims = 0;
                local_440.w = 0;
                local_440.h = 0;
                local_440.d = 0;
                local_440.c = 0;
                local_440.cstep = 0;
                ParamDict::get(&local_3f8,&local_358,0x1e,&local_440);
                local_278 = &local_440;
                local_188 = local_278;
                if (local_440.refcount != (int *)0x0) {
                  local_18c = 0xffffffff;
                  LOCK();
                  local_190 = *local_440.refcount;
                  *local_440.refcount = *local_440.refcount + -1;
                  UNLOCK();
                  if (local_190 == 1) {
                    if (local_440.allocator == (Allocator *)0x0) {
                      local_60 = local_440.data;
                      if (local_440.data != (void *)0x0) {
                        free(local_440.data);
                      }
                    }
                    else {
                      (*(local_440.allocator)->_vptr_Allocator[3])
                                (local_440.allocator,local_440.data);
                    }
                  }
                }
                local_440.data = (void *)0x0;
                local_440.elemsize = 0;
                local_440.elempack = 0;
                local_440.dims = 0;
                local_440.w = 0;
                local_440.h = 0;
                local_440.d = 0;
                local_440.c = 0;
                local_440.cstep = 0;
                local_440.refcount = (int *)0x0;
                local_228 = &local_3f8;
                if ((int *)local_3f8.data != (int *)0x0) {
                  local_90 = local_228;
                }
                if ((int *)local_3f8.data != (int *)0x0 && local_3f8.cstep * (long)local_3f8.c != 0)
                {
                  local_130 = &local_3f8;
                  local_448 = (int *)local_3f8.data;
                  for (local_44c = 0; local_44c < local_368; local_44c = local_44c + 1) {
                    lVar5 = in_RDI[9];
                    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                       ((vector<int,_std::allocator<int>_> *)
                                        &(local_380->output_blob_names).
                                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,(long)local_44c)
                    ;
                    pvVar7 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                       ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                        (lVar5 + 8),(long)*pvVar6);
                    local_45c = *local_448;
                    local_458 = pvVar7;
                    if (local_45c == 1) {
                      local_104 = local_448[1];
                      local_100 = &local_4a8;
                      local_110 = 0;
                      local_118 = 4;
                      local_11c = 1;
                      local_128 = 0;
                      local_4a8 = (void *)0x0;
                      local_4a0 = (int *)0x0;
                      local_498 = 4;
                      local_490 = 1;
                      local_488 = (long *)0x0;
                      local_480 = 1;
                      local_47c = local_104;
                      local_478 = 1;
                      local_474 = 1;
                      local_470 = 1;
                      local_468 = (long)local_104;
                      pMVar12 = &pvVar7->shape;
                      local_290 = &local_4a8;
                      local_288 = pMVar12;
                      if (pMVar12 != (Mat *)local_290) {
                        local_178 = pMVar12;
                        if ((pvVar7->shape).refcount != (int *)0x0) {
                          piVar1 = (pvVar7->shape).refcount;
                          local_17c = 0xffffffff;
                          LOCK();
                          local_180 = *piVar1;
                          *piVar1 = *piVar1 + -1;
                          UNLOCK();
                          if (local_180 == 1) {
                            if ((pvVar7->shape).allocator == (Allocator *)0x0) {
                              local_68 = pMVar12->data;
                              if (local_68 != (void *)0x0) {
                                free(local_68);
                              }
                            }
                            else {
                              pAVar2 = (pvVar7->shape).allocator;
                              (*pAVar2->_vptr_Allocator[3])(pAVar2,pMVar12->data);
                            }
                          }
                        }
                        pMVar12->data = (void *)0x0;
                        (pvVar7->shape).elemsize = 0;
                        (pvVar7->shape).elempack = 0;
                        (pvVar7->shape).dims = 0;
                        (pvVar7->shape).w = 0;
                        (pvVar7->shape).h = 0;
                        (pvVar7->shape).d = 0;
                        (pvVar7->shape).c = 0;
                        (pvVar7->shape).cstep = 0;
                        (pvVar7->shape).refcount = (int *)0x0;
                        pMVar12->data = *local_290;
                        (pvVar7->shape).refcount = (int *)local_290[1];
                        (pvVar7->shape).elemsize = (size_t)local_290[2];
                        (pvVar7->shape).elempack = *(int *)(local_290 + 3);
                        (pvVar7->shape).allocator = (Allocator *)local_290[4];
                        (pvVar7->shape).dims = *(int *)(local_290 + 5);
                        (pvVar7->shape).w = *(int *)((long)local_290 + 0x2c);
                        (pvVar7->shape).h = *(int *)(local_290 + 6);
                        (pvVar7->shape).d = *(int *)((long)local_290 + 0x34);
                        (pvVar7->shape).c = *(int *)(local_290 + 7);
                        (pvVar7->shape).cstep = (size_t)local_290[8];
                      }
                      local_268 = &local_4a8;
                      local_280 = pMVar12;
                      local_1a8 = local_268;
                      if (local_4a0 != (int *)0x0) {
                        local_1ac = 0xffffffff;
                        LOCK();
                        local_1b0 = *local_4a0;
                        *local_4a0 = *local_4a0 + -1;
                        UNLOCK();
                        if (local_1b0 == 1) {
                          if (local_488 == (long *)0x0) {
                            local_50 = local_4a8;
                            if (local_4a8 != (void *)0x0) {
                              free(local_4a8);
                            }
                          }
                          else {
                            (**(code **)(*local_488 + 0x18))(local_488,local_4a8);
                          }
                        }
                      }
                      local_4a8 = (void *)0x0;
                      local_498 = 0;
                      local_490 = 0;
                      local_480 = 0;
                      local_47c = 0;
                      local_478 = 0;
                      local_474 = 0;
                      local_470 = 0;
                      local_468 = 0;
                      local_4a0 = (int *)0x0;
                    }
                    pvVar7 = local_458;
                    if (local_45c == 2) {
                      local_d4 = local_448[1];
                      local_d8 = local_448[2];
                      local_d0 = &local_4f0;
                      local_e0 = 0;
                      local_e8 = 4;
                      local_ec = 1;
                      local_f8 = 0;
                      local_4f0 = (void *)0x0;
                      local_4e8 = (int *)0x0;
                      local_4e0 = 4;
                      local_4d8 = 1;
                      local_4d0 = (long *)0x0;
                      local_4c8 = 2;
                      local_4c4 = local_d4;
                      local_4c0 = local_d8;
                      local_4bc = 1;
                      local_4b8 = 1;
                      local_4b0 = (long)local_d4 * (long)local_d8;
                      pMVar12 = &local_458->shape;
                      local_2b0 = &local_4f0;
                      local_2a8 = pMVar12;
                      if (pMVar12 != (Mat *)local_2b0) {
                        local_168 = pMVar12;
                        if ((local_458->shape).refcount != (int *)0x0) {
                          piVar1 = (local_458->shape).refcount;
                          local_16c = 0xffffffff;
                          LOCK();
                          local_170 = *piVar1;
                          *piVar1 = *piVar1 + -1;
                          UNLOCK();
                          if (local_170 == 1) {
                            if ((local_458->shape).allocator == (Allocator *)0x0) {
                              local_70 = pMVar12->data;
                              if (local_70 != (void *)0x0) {
                                free(local_70);
                              }
                            }
                            else {
                              pAVar2 = (local_458->shape).allocator;
                              (*pAVar2->_vptr_Allocator[3])(pAVar2,pMVar12->data);
                            }
                          }
                        }
                        pMVar12->data = (void *)0x0;
                        (pvVar7->shape).elemsize = 0;
                        (pvVar7->shape).elempack = 0;
                        (pvVar7->shape).dims = 0;
                        (pvVar7->shape).w = 0;
                        (pvVar7->shape).h = 0;
                        (pvVar7->shape).d = 0;
                        (pvVar7->shape).c = 0;
                        (pvVar7->shape).cstep = 0;
                        (pvVar7->shape).refcount = (int *)0x0;
                        pMVar12->data = *local_2b0;
                        (pvVar7->shape).refcount = (int *)local_2b0[1];
                        (pvVar7->shape).elemsize = (size_t)local_2b0[2];
                        (pvVar7->shape).elempack = *(int *)(local_2b0 + 3);
                        (pvVar7->shape).allocator = (Allocator *)local_2b0[4];
                        (pvVar7->shape).dims = *(int *)(local_2b0 + 5);
                        (pvVar7->shape).w = *(int *)((long)local_2b0 + 0x2c);
                        (pvVar7->shape).h = *(int *)(local_2b0 + 6);
                        (pvVar7->shape).d = *(int *)((long)local_2b0 + 0x34);
                        (pvVar7->shape).c = *(int *)(local_2b0 + 7);
                        (pvVar7->shape).cstep = (size_t)local_2b0[8];
                      }
                      local_258 = &local_4f0;
                      local_2a0 = pMVar12;
                      local_1c8 = local_258;
                      if (local_4e8 != (int *)0x0) {
                        local_1cc = 0xffffffff;
                        LOCK();
                        local_1d0 = *local_4e8;
                        *local_4e8 = *local_4e8 + -1;
                        UNLOCK();
                        if (local_1d0 == 1) {
                          if (local_4d0 == (long *)0x0) {
                            local_40 = local_4f0;
                            if (local_4f0 != (void *)0x0) {
                              free(local_4f0);
                            }
                          }
                          else {
                            (**(code **)(*local_4d0 + 0x18))(local_4d0,local_4f0);
                          }
                        }
                      }
                      local_4f0 = (void *)0x0;
                      local_4e0 = 0;
                      local_4d8 = 0;
                      local_4c8 = 0;
                      local_4c4 = 0;
                      local_4c0 = 0;
                      local_4bc = 0;
                      local_4b8 = 0;
                      local_4b0 = 0;
                      local_4e8 = (int *)0x0;
                    }
                    if (local_45c == 3) {
                      local_9c = local_448[1];
                      local_a0 = local_448[2];
                      local_a4 = local_448[3];
                      local_98 = &local_538;
                      local_b0 = 0;
                      local_b8 = 4;
                      local_bc = 1;
                      local_c8 = 0;
                      local_538._vptr_ParamDict = (_func_int **)0x0;
                      local_538.d = (ParamDictPrivate *)0x0;
                      local_528 = 4;
                      local_520 = 1;
                      local_518 = (long *)0x0;
                      local_510 = 3;
                      local_50c = local_9c;
                      local_508 = local_a0;
                      local_504 = 1;
                      local_500 = local_a4;
                      local_8 = (long)local_9c * (long)local_a0 * 4;
                      local_c = 0x10;
                      uVar8 = local_8 + 0xfU & 0xfffffffffffffff0;
                      local_4f8 = uVar8 / 4;
                      in_stack_fffffffffffff970 = &local_458->shape;
                      local_2d0 = &local_538;
                      local_2c8 = in_stack_fffffffffffff970;
                      if (in_stack_fffffffffffff970 != (Mat *)local_2d0) {
                        pMVar12 = in_stack_fffffffffffff970;
                        local_158 = in_stack_fffffffffffff970;
                        if ((local_458->shape).refcount != (int *)0x0) {
                          piVar1 = (local_458->shape).refcount;
                          local_15c = 0xffffffff;
                          LOCK();
                          local_160 = *piVar1;
                          *piVar1 = *piVar1 + -1;
                          UNLOCK();
                          if (local_160 == 1) {
                            if ((local_458->shape).allocator == (Allocator *)0x0) {
                              local_78 = in_stack_fffffffffffff970->data;
                              if (local_78 != (void *)0x0) {
                                free(local_78);
                              }
                            }
                            else {
                              pAVar2 = (local_458->shape).allocator;
                              (*pAVar2->_vptr_Allocator[3])
                                        (pAVar2,in_stack_fffffffffffff970->data,uVar8 % 4);
                            }
                          }
                        }
                        in_stack_fffffffffffff970->data = (void *)0x0;
                        in_stack_fffffffffffff970->elemsize = 0;
                        in_stack_fffffffffffff970->elempack = 0;
                        in_stack_fffffffffffff970->dims = 0;
                        in_stack_fffffffffffff970->w = 0;
                        in_stack_fffffffffffff970->h = 0;
                        in_stack_fffffffffffff970->d = 0;
                        in_stack_fffffffffffff970->c = 0;
                        in_stack_fffffffffffff970->cstep = 0;
                        in_stack_fffffffffffff970->refcount = (int *)0x0;
                        pMVar12->data = local_2d0->_vptr_ParamDict;
                        pMVar12->refcount = (int *)local_2d0->d;
                        pMVar12->elemsize = (size_t)local_2d0[1]._vptr_ParamDict;
                        pMVar12->elempack = *(int *)&local_2d0[1].d;
                        pMVar12->allocator = (Allocator *)local_2d0[2]._vptr_ParamDict;
                        pMVar12->dims = *(int *)&local_2d0[2].d;
                        pMVar12->w = *(int *)((long)&local_2d0[2].d + 4);
                        pMVar12->h = *(int *)&local_2d0[3]._vptr_ParamDict;
                        pMVar12->d = *(int *)((long)&local_2d0[3]._vptr_ParamDict + 4);
                        pMVar12->c = *(int *)&local_2d0[3].d;
                        pMVar12->cstep = (size_t)local_2d0[4]._vptr_ParamDict;
                        in_stack_fffffffffffff968 = in_stack_fffffffffffff970;
                        in_stack_fffffffffffff970 = pMVar12;
                      }
                      in_stack_fffffffffffff960 = &local_538;
                      local_2c0 = in_stack_fffffffffffff970;
                      local_248 = in_stack_fffffffffffff960;
                      local_1e8 = in_stack_fffffffffffff960;
                      if (local_538.d != (ParamDictPrivate *)0x0) {
                        local_1ec = 0xffffffff;
                        LOCK();
                        local_1f0 = (local_538.d)->params[0].type;
                        (local_538.d)->params[0].type = (local_538.d)->params[0].type + -1;
                        UNLOCK();
                        if (local_1f0 == 1) {
                          if (local_518 == (long *)0x0) {
                            local_30 = local_538._vptr_ParamDict;
                            if (local_538._vptr_ParamDict != (_func_int **)0x0) {
                              free(local_538._vptr_ParamDict);
                            }
                          }
                          else {
                            (**(code **)(*local_518 + 0x18))(local_518,local_538._vptr_ParamDict);
                          }
                        }
                      }
                      in_stack_fffffffffffff960->_vptr_ParamDict = (_func_int **)0x0;
                      in_stack_fffffffffffff960[1]._vptr_ParamDict = (_func_int **)0x0;
                      *(undefined4 *)&in_stack_fffffffffffff960[1].d = 0;
                      *(undefined4 *)&in_stack_fffffffffffff960[2].d = 0;
                      *(undefined4 *)((long)&in_stack_fffffffffffff960[2].d + 4) = 0;
                      *(undefined4 *)&in_stack_fffffffffffff960[3]._vptr_ParamDict = 0;
                      *(undefined4 *)((long)&in_stack_fffffffffffff960[3]._vptr_ParamDict + 4) = 0;
                      *(undefined4 *)&in_stack_fffffffffffff960[3].d = 0;
                      in_stack_fffffffffffff960[4]._vptr_ParamDict = (_func_int **)0x0;
                      in_stack_fffffffffffff960->d = (ParamDictPrivate *)0x0;
                    }
                    local_448 = local_448 + 4;
                  }
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                           (size_type)in_stack_fffffffffffff8e8);
                for (local_53c = 0; local_53c < local_364; local_53c = local_53c + 1) {
                  lVar5 = in_RDI[9];
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)
                                      &(local_380->input_blob_names).
                                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,(long)local_53c);
                  pvVar7 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(lVar5 + 8)
                                      ,(long)*pvVar6);
                  pMVar12 = &pvVar7->shape;
                  pvVar9 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                     ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                      &(local_380->custom_layer_registry).
                                       super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,(long)local_53c);
                  local_2f0 = pMVar12;
                  local_2e8 = pvVar9;
                  if (pvVar9 != pMVar12) {
                    if ((pvVar7->shape).refcount != (int *)0x0) {
                      piVar1 = (pvVar7->shape).refcount;
                      local_2f4 = 1;
                      LOCK();
                      local_2f8 = *piVar1;
                      *piVar1 = *piVar1 + 1;
                      UNLOCK();
                    }
                    local_148 = pvVar9;
                    if (pvVar9->refcount != (int *)0x0) {
                      piVar1 = pvVar9->refcount;
                      local_14c = 0xffffffff;
                      LOCK();
                      local_150 = *piVar1;
                      *piVar1 = *piVar1 + -1;
                      UNLOCK();
                      if (local_150 == 1) {
                        if (pvVar9->allocator == (Allocator *)0x0) {
                          local_80 = pvVar9->data;
                          if (local_80 != (void *)0x0) {
                            free(local_80);
                          }
                        }
                        else {
                          (*pvVar9->allocator->_vptr_Allocator[3])(pvVar9->allocator,pvVar9->data);
                        }
                      }
                    }
                    pvVar9->data = (void *)0x0;
                    pvVar9->elemsize = 0;
                    pvVar9->elempack = 0;
                    pvVar9->dims = 0;
                    pvVar9->w = 0;
                    pvVar9->h = 0;
                    pvVar9->d = 0;
                    pvVar9->c = 0;
                    pvVar9->cstep = 0;
                    pvVar9->refcount = (int *)0x0;
                    pvVar9->data = local_2f0->data;
                    pvVar9->refcount = local_2f0->refcount;
                    pvVar9->elemsize = local_2f0->elemsize;
                    pvVar9->elempack = local_2f0->elempack;
                    pvVar9->allocator = local_2f0->allocator;
                    pvVar9->dims = local_2f0->dims;
                    pvVar9->w = local_2f0->w;
                    pvVar9->h = local_2f0->h;
                    pvVar9->d = local_2f0->d;
                    pvVar9->c = local_2f0->c;
                    pvVar9->cstep = local_2f0->cstep;
                  }
                  local_2e0 = pvVar9;
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                           (size_type)in_stack_fffffffffffff8e8);
                for (local_540 = 0; iVar11 = (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                    local_540 < local_368; local_540 = local_540 + 1) {
                  lVar5 = in_RDI[9];
                  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)
                                      &(local_380->output_blob_names).
                                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,(long)local_540);
                  pvVar7 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(lVar5 + 8)
                                      ,(long)*pvVar6);
                  pMVar12 = &pvVar7->shape;
                  pvVar9 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                     ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                      &(local_380->overwrite_builtin_layer_registry).
                                       super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,(long)local_540);
                  local_310 = pMVar12;
                  local_308 = pvVar9;
                  if (pvVar9 != pMVar12) {
                    if ((pvVar7->shape).refcount != (int *)0x0) {
                      piVar1 = (pvVar7->shape).refcount;
                      local_314 = 1;
                      LOCK();
                      local_318 = *piVar1;
                      *piVar1 = *piVar1 + 1;
                      UNLOCK();
                    }
                    local_138 = pvVar9;
                    if (pvVar9->refcount != (int *)0x0) {
                      piVar1 = pvVar9->refcount;
                      local_13c = 0xffffffff;
                      LOCK();
                      local_140 = *piVar1;
                      *piVar1 = *piVar1 + -1;
                      UNLOCK();
                      if (local_140 == 1) {
                        if (pvVar9->allocator == (Allocator *)0x0) {
                          local_88 = pvVar9->data;
                          if (local_88 != (void *)0x0) {
                            free(local_88);
                          }
                        }
                        else {
                          (*pvVar9->allocator->_vptr_Allocator[3])(pvVar9->allocator,pvVar9->data);
                        }
                      }
                    }
                    pvVar9->data = (void *)0x0;
                    pvVar9->elemsize = 0;
                    pvVar9->elempack = 0;
                    pvVar9->dims = 0;
                    pvVar9->w = 0;
                    pvVar9->h = 0;
                    pvVar9->d = 0;
                    pvVar9->c = 0;
                    pvVar9->cstep = 0;
                    pvVar9->refcount = (int *)0x0;
                    pvVar9->data = local_310->data;
                    pvVar9->refcount = local_310->refcount;
                    pvVar9->elemsize = local_310->elemsize;
                    pvVar9->elempack = local_310->elempack;
                    pvVar9->allocator = local_310->allocator;
                    pvVar9->dims = local_310->dims;
                    pvVar9->w = local_310->w;
                    pvVar9->h = local_310->h;
                    pvVar9->d = local_310->d;
                    pvVar9->c = local_310->c;
                    pvVar9->cstep = local_310->cstep;
                  }
                  local_300 = pvVar9;
                }
                iVar4 = ParamDict::get(&local_358,0x1f,0);
                *(int *)((long)&(local_380->blobs).
                                super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 4) = iVar4;
                iVar4 = (*(code *)local_380->opt->workspace_allocator)(local_380,&local_358);
                if (iVar4 == 0) {
                  if (((ulong)(local_380->blobs).
                              super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                              super__Vector_impl_data._M_start & 0x1000000000000) != 0) {
                    *(undefined1 *)((long)in_RDI + 0x27) = 0;
                  }
                  get_masked_option((Option *)
                                    CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                                    (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
                  if ((local_3ac == 0) ||
                     ((((ulong)(local_380->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start & 0x10000) != 0 &&
                      ((local_569 & 1) != 0)))) {
LAB_0015ecc3:
                    pNVar3 = local_380;
                    ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::
                               operator[]((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                          (in_RDI[9] + 0x20),(long)(int)local_35c);
                    *ppLVar10 = (value_type)pNVar3;
                    local_378 = 0;
                  }
                  else {
                    local_590 = (NetPrivate *)(**(code **)(*in_RDI + 0x30))(in_RDI,local_360);
                    if (local_590 == (NetPrivate *)0x0) {
                      in_stack_fffffffffffff900 = (NetPrivate *)create_layer_cpu(iVar11);
                      local_590 = in_stack_fffffffffffff900;
                    }
                    if (local_590 == (NetPrivate *)0x0) {
                      local_590 = (NetPrivate *)
                                  (**(code **)(*in_RDI + 0x28))(in_RDI,local_360 & 0xfffffeff);
                    }
                    if (local_590 == (NetPrivate *)0x0) {
                      fprintf(_stderr,"layer %d not exists or registered",(ulong)local_360);
                      fprintf(_stderr,"\n");
                      clear(in_stack_fffffffffffff980);
                      local_324 = -1;
                      local_378 = 1;
                    }
                    else {
                      std::vector<int,_std::allocator<int>_>::operator=
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff968);
                      std::vector<int,_std::allocator<int>_>::operator=
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff968);
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                 in_stack_fffffffffffff970,
                                 (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                 in_stack_fffffffffffff968);
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                 in_stack_fffffffffffff970,
                                 (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                 in_stack_fffffffffffff968);
                      *(int *)((long)&(local_590->blobs).
                                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                           *(int *)((long)&(local_380->blobs).
                                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
                      in_stack_fffffffffffff8f4 =
                           (*(code *)local_590->opt->workspace_allocator)(local_590,&local_358);
                      if (in_stack_fffffffffffff8f4 == 0) {
                        in_stack_fffffffffffff8e8 = local_380;
                        if (local_380 != (NetPrivate *)0x0) {
                          (*(code *)local_380->opt->blob_allocator)();
                          in_stack_fffffffffffff8e8 = local_380;
                        }
                        local_380 = local_590;
                        goto LAB_0015ecc3;
                      }
                      fprintf(_stderr,"layer load_param %d failed",(ulong)local_35c);
                      fprintf(_stderr,"\n");
                      local_378 = 0xe;
                    }
                  }
                }
                else {
                  fprintf(_stderr,"layer load_param %d failed",(ulong)local_35c);
                  fprintf(_stderr,"\n");
                  local_378 = 0xe;
                }
                in_stack_fffffffffffff8d8 = &local_3f8;
                local_238 = in_stack_fffffffffffff8d8;
                local_208 = in_stack_fffffffffffff8d8;
                if (local_3f8.refcount != (int *)0x0) {
                  local_20c = 0xffffffff;
                  LOCK();
                  local_210 = *local_3f8.refcount;
                  *local_3f8.refcount = *local_3f8.refcount + -1;
                  UNLOCK();
                  if (local_210 == 1) {
                    if (local_3f8.allocator == (Allocator *)0x0) {
                      if ((int *)local_3f8.data != (int *)0x0) {
                        free(local_3f8.data);
                      }
                    }
                    else {
                      (*(local_3f8.allocator)->_vptr_Allocator[3])
                                (local_3f8.allocator,local_3f8.data);
                    }
                  }
                }
                in_stack_fffffffffffff8d8->data = (void *)0x0;
                in_stack_fffffffffffff8d8->elemsize = 0;
                in_stack_fffffffffffff8d8->elempack = 0;
                in_stack_fffffffffffff8d8->dims = 0;
                in_stack_fffffffffffff8d8->w = 0;
                in_stack_fffffffffffff8d8->h = 0;
                in_stack_fffffffffffff8d8->d = 0;
                in_stack_fffffffffffff8d8->c = 0;
                in_stack_fffffffffffff8d8->cstep = 0;
                in_stack_fffffffffffff8d8->refcount = (int *)0x0;
                in_stack_fffffffffffff8d4 = local_378;
                if ((local_378 != 0) && (local_378 != 0xe)) goto LAB_0015ef7a;
              }
              else {
                fprintf(_stderr,"ParamDict load_param_bin %d failed",(ulong)local_35c);
                fprintf(_stderr,"\n");
              }
            }
            NetPrivate::update_input_output_indexes(in_stack_fffffffffffff900);
            local_324 = 0;
            local_378 = 1;
LAB_0015ef7a:
            ParamDict::~ParamDict
                      ((ParamDict *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          }
        }
        else {
          fprintf(_stderr,"read blob_count failed");
          fprintf(_stderr,"\n");
          local_324 = -1;
        }
      }
      else {
        fprintf(_stderr,"read layer_count failed");
        fprintf(_stderr,"\n");
        local_324 = -1;
      }
    }
    else {
      fprintf(_stderr,"param is too old, please regenerate");
      fprintf(_stderr,"\n");
      local_324 = -1;
    }
  }
  else {
    fprintf(_stderr,"read magic failed");
    fprintf(_stderr,"\n");
    local_324 = -1;
  }
  return local_324;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#if __BIG_ENDIAN__
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }                                              \
    if (sizeof(buf) == 2)                          \
        swap_endianness_16(&buf);                  \
    if (sizeof(buf) == 4)                          \
        swap_endianness_32(&buf);
#else
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }
#endif

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize(layer_count);
    d->blobs.resize(blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev)
        {
            int device_index = opt.vulkan_device_index;
            if (device_index < 0 || device_index >= get_gpu_count())
                device_index = get_default_gpu_index();

            d->vkdev = get_gpu_device(device_index);
        }
        if (!d->vkdev || !d->vkdev->is_valid()) opt.use_vulkan_compute = false; // no valid vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_uniform()) opt.use_fp16_uniform = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_packed()) opt.use_int8_packed = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_uniform()) opt.use_int8_uniform = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;
        if (!d->vkdev->info.support_subgroup_ops()) opt.use_subgroup_ops = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        if (opt.use_image_storage && !d->vkdev->info.support_fp16_image())
        {
            opt.use_fp16_storage = false;
            opt.use_fp16_uniform = false;
        }

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;

        // fp16 uniform makes no sense when fp16 arithmetic disabled
        if (!opt.use_fp16_arithmetic) opt.use_fp16_uniform = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i = 0; i < layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_overwrite_builtin_layer(typeindex);
#if NCNN_VULKAN
        if (!layer && opt.use_vulkan_compute && d->vkdev)
        {
            layer = create_layer_vulkan(typeindex);
        }
#endif // NCNN_VULKAN
        if (!layer)
        {
            layer = create_layer_cpu(typeindex);
        }
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        //         layer->type = std::string(layer_type);
        //         layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = d->blobs[top_blob_index];

            //             blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        int layer_support_vulkan = layer->support_vulkan;

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param_bin %d failed", i);
            continue;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        // pull out layer specific feature disabled set
        layer->featmask = pd.get(31, 0);

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d failed", i);
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        Option opt1 = get_masked_option(opt, layer->featmask);
#if NCNN_VULKAN
        if (opt1.use_vulkan_compute)
        {
            if (!layer->support_image_storage) opt1.use_image_storage = false;
        }
#endif // NCNN_VULKAN

        if (layer_support_vulkan && (!layer->support_vulkan || !opt1.use_vulkan_compute))
        {
            // vulkan layer cannot handle these param, recreate cpu layer
            Layer* layer_cpu = create_overwrite_builtin_layer(typeindex);
            if (!layer_cpu)
            {
                layer_cpu = create_layer_cpu(typeindex);
            }
            if (!layer_cpu)
            {
                int custom_index = typeindex & ~LayerType::CustomBit;
                layer_cpu = create_custom_layer(custom_index);
            }
            if (!layer_cpu)
            {
                NCNN_LOGE("layer %d not exists or registered", typeindex);
                clear();
                return -1;
            }

            layer_cpu->bottoms = layer->bottoms;
            layer_cpu->tops = layer->tops;
            layer_cpu->bottom_shapes = layer->bottom_shapes;
            layer_cpu->top_shapes = layer->top_shapes;
            layer_cpu->featmask = layer->featmask;

            int lr = layer_cpu->load_param(pd);
            if (lr != 0)
            {
                NCNN_LOGE("layer load_param %d failed", i);
                continue;
            }

            delete layer;
            layer = layer_cpu;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();

#undef READ_VALUE
    return 0;
}